

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O0

bool ConvertBits<8,5,true,EncodeBase32[abi:cxx11](Span<unsigned_char_const>,bool)::__0,unsigned_char_const*,(anonymous_namespace)::IntIdentity>
               (undefined8 param_1,long param_2,long param_3)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  int v;
  size_t max_acc;
  size_t maxv;
  size_t bits;
  size_t acc;
  IntIdentity *in_stack_ffffffffffffffa8;
  undefined8 local_38;
  undefined8 local_20;
  undefined1 local_12;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0;
  local_20 = param_2;
  do {
    if (local_20 == param_3) {
      if (local_38 != 0) {
        EncodeBase32::anon_class_8_1_ba1d7991::operator()
                  ((anon_class_8_1_ba1d7991 *)in_stack_ffffffffffffffa8,0);
      }
      local_12 = true;
LAB_01ac6cdd:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_12;
      }
      __stack_chk_fail();
    }
    iVar2 = anon_unknown.dwarf_3512057::IntIdentity::operator()(in_stack_ffffffffffffffa8,0);
    if (iVar2 < 0) {
      local_12 = false;
      goto LAB_01ac6cdd;
    }
    local_38 = local_38 + 8;
    while (4 < local_38) {
      local_38 = local_38 - 5;
      EncodeBase32::anon_class_8_1_ba1d7991::operator()
                ((anon_class_8_1_ba1d7991 *)in_stack_ffffffffffffffa8,0);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool ConvertBits(O outfn, It it, It end, I infn = {}) {
    size_t acc = 0;
    size_t bits = 0;
    constexpr size_t maxv = (1 << tobits) - 1;
    constexpr size_t max_acc = (1 << (frombits + tobits - 1)) - 1;
    while (it != end) {
        int v = infn(*it);
        if (v < 0) return false;
        acc = ((acc << frombits) | v) & max_acc;
        bits += frombits;
        while (bits >= tobits) {
            bits -= tobits;
            outfn((acc >> bits) & maxv);
        }
        ++it;
    }
    if (pad) {
        if (bits) outfn((acc << (tobits - bits)) & maxv);
    } else if (bits >= frombits || ((acc << (tobits - bits)) & maxv)) {
        return false;
    }
    return true;
}